

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O3

void deqp::sl::setUniformValue
               (Functions *gl,deUint32 programID,string *name,Value *val,int arrayNdx)

{
  int iVar1;
  GLint GVar2;
  TestError *this;
  int iVar3;
  glUniform3fvFunc UNRECOVERED_JUMPTABLE_00;
  pointer pEVar4;
  glUniformMatrix4x2fvFunc UNRECOVERED_JUMPTABLE;
  
  iVar1 = glu::getDataTypeScalarSize(val->dataType);
  GVar2 = (*gl->getUniformLocation)(programID,(name->_M_dataplus)._M_p);
  if (GVar2 == -1) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"uniform location not found","loc != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
               ,0x81);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = 0;
  if (val->arrayLength != 1) {
    iVar3 = iVar1 * arrayNdx;
  }
  switch(val->dataType) {
  case TYPE_FLOAT:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = gl->uniform1fv;
    break;
  case TYPE_FLOAT_VEC2:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = gl->uniform2fv;
    break;
  case TYPE_FLOAT_VEC3:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = gl->uniform3fv;
    break;
  case TYPE_FLOAT_VEC4:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = gl->uniform4fv;
    break;
  case TYPE_FLOAT_MAT2:
    UNRECOVERED_JUMPTABLE = gl->uniformMatrix2fv;
    goto LAB_00da07ab;
  case TYPE_FLOAT_MAT2X3:
    UNRECOVERED_JUMPTABLE = gl->uniformMatrix2x3fv;
    goto LAB_00da07ab;
  case TYPE_FLOAT_MAT2X4:
    UNRECOVERED_JUMPTABLE = gl->uniformMatrix2x4fv;
    goto LAB_00da07ab;
  case TYPE_FLOAT_MAT3X2:
    UNRECOVERED_JUMPTABLE = gl->uniformMatrix3x2fv;
    goto LAB_00da07ab;
  case TYPE_FLOAT_MAT3:
    UNRECOVERED_JUMPTABLE = gl->uniformMatrix3fv;
    goto LAB_00da07ab;
  case TYPE_FLOAT_MAT3X4:
    UNRECOVERED_JUMPTABLE = gl->uniformMatrix3x4fv;
    goto LAB_00da07ab;
  case TYPE_FLOAT_MAT4X2:
    UNRECOVERED_JUMPTABLE = gl->uniformMatrix4x2fv;
    goto LAB_00da07ab;
  case TYPE_FLOAT_MAT4X3:
    UNRECOVERED_JUMPTABLE = gl->uniformMatrix4x3fv;
    goto LAB_00da07ab;
  case TYPE_FLOAT_MAT4:
    UNRECOVERED_JUMPTABLE = gl->uniformMatrix4fv;
LAB_00da07ab:
    (*UNRECOVERED_JUMPTABLE)
              (GVar2,1,'\0',
               &(val->elements).
                super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar3].float32);
    return;
  default:
    return;
  case TYPE_INT:
  case TYPE_BOOL:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = (glUniform3fvFunc)gl->uniform1iv;
    break;
  case TYPE_INT_VEC2:
  case TYPE_BOOL_VEC2:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = (glUniform3fvFunc)gl->uniform2iv;
    break;
  case TYPE_INT_VEC3:
  case TYPE_BOOL_VEC3:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = (glUniform3fvFunc)gl->uniform3iv;
    break;
  case TYPE_INT_VEC4:
  case TYPE_BOOL_VEC4:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = (glUniform3fvFunc)gl->uniform4iv;
    break;
  case TYPE_UINT:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = (glUniform3fvFunc)gl->uniform1uiv;
    break;
  case TYPE_UINT_VEC2:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = (glUniform3fvFunc)gl->uniform2uiv;
    break;
  case TYPE_UINT_VEC3:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = (glUniform3fvFunc)gl->uniform3uiv;
    break;
  case TYPE_UINT_VEC4:
    pEVar4 = (val->elements).
             super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar3;
    UNRECOVERED_JUMPTABLE_00 = (glUniform3fvFunc)gl->uniform4uiv;
  }
  (*UNRECOVERED_JUMPTABLE_00)(GVar2,1,&pEVar4->float32);
  return;
}

Assistant:

static void setUniformValue(const glw::Functions& gl, deUint32 programID, const std::string& name,
							const ShaderCase::Value& val, int arrayNdx)
{
	int scalarSize = getDataTypeScalarSize(val.dataType);
	int loc		   = gl.getUniformLocation(programID, name.c_str());

	TCU_CHECK_MSG(loc != -1, "uniform location not found");

	DE_STATIC_ASSERT(sizeof(ShaderCase::Value::Element) == sizeof(glw::GLfloat));
	DE_STATIC_ASSERT(sizeof(ShaderCase::Value::Element) == sizeof(glw::GLint));

	int elemNdx = (val.arrayLength == 1) ? 0 : (arrayNdx * scalarSize);

	switch (val.dataType)
	{
	case TYPE_FLOAT:
		gl.uniform1fv(loc, 1, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_VEC2:
		gl.uniform2fv(loc, 1, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_VEC3:
		gl.uniform3fv(loc, 1, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_VEC4:
		gl.uniform4fv(loc, 1, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT2:
		gl.uniformMatrix2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT3:
		gl.uniformMatrix3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT4:
		gl.uniformMatrix4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_INT:
		gl.uniform1iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_INT_VEC2:
		gl.uniform2iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_INT_VEC3:
		gl.uniform3iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_INT_VEC4:
		gl.uniform4iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_BOOL:
		gl.uniform1iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_BOOL_VEC2:
		gl.uniform2iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_BOOL_VEC3:
		gl.uniform3iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_BOOL_VEC4:
		gl.uniform4iv(loc, 1, &val.elements[elemNdx].int32);
		break;
	case TYPE_UINT:
		gl.uniform1uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);
		break;
	case TYPE_UINT_VEC2:
		gl.uniform2uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);
		break;
	case TYPE_UINT_VEC3:
		gl.uniform3uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);
		break;
	case TYPE_UINT_VEC4:
		gl.uniform4uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);
		break;
	case TYPE_FLOAT_MAT2X3:
		gl.uniformMatrix2x3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT2X4:
		gl.uniformMatrix2x4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT3X2:
		gl.uniformMatrix3x2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT3X4:
		gl.uniformMatrix3x4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT4X2:
		gl.uniformMatrix4x2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;
	case TYPE_FLOAT_MAT4X3:
		gl.uniformMatrix4x3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);
		break;

	case TYPE_SAMPLER_2D:
	case TYPE_SAMPLER_CUBE:
		DE_ASSERT(DE_FALSE && "implement!");
		break;

	default:
		DE_ASSERT(false);
	}
}